

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.h
# Opt level: O2

void __thiscall brotli::RingBuffer::RingBuffer(RingBuffer *this,int window_bits,int tail_bits)

{
  uint32_t uVar1;
  size_t i;
  uint8_t *puVar2;
  long lVar3;
  uint32_t uVar4;
  ulong uVar5;
  
  uVar1 = 1 << ((byte)window_bits & 0x1f);
  this->size_ = uVar1;
  this->mask_ = uVar1 - 1;
  uVar4 = 1 << ((byte)tail_bits & 0x1f);
  this->tail_size_ = uVar4;
  this->pos_ = 0;
  uVar5 = (ulong)(uVar4 + uVar1);
  puVar2 = (uint8_t *)operator_new__(uVar5 + 9);
  this->data_ = puVar2;
  this->buffer_ = puVar2 + 2;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    this->buffer_[lVar3 + uVar5] = '\0';
  }
  this->buffer_[this->size_ - 2] = '\0';
  this->buffer_[-2] = '\0';
  this->buffer_[this->size_ - 1] = '\0';
  this->buffer_[-1] = '\0';
  return;
}

Assistant:

RingBuffer(int window_bits, int tail_bits)
      : size_(1u << window_bits),
        mask_((1u << window_bits) - 1),
        tail_size_(1u << tail_bits),
        pos_(0) {
    static const size_t kSlackForEightByteHashingEverywhere = 7;
    const size_t buflen = size_ + tail_size_;
    data_ = new uint8_t[2 + buflen + kSlackForEightByteHashingEverywhere];
    buffer_ = data_ + 2;
    for (size_t i = 0; i < kSlackForEightByteHashingEverywhere; ++i) {
      buffer_[buflen + i] = 0;
    }
    // Initialize the last two bytes and their copy to zero.
    buffer_[-2] = buffer_[size_ - 2] = 0;
    buffer_[-1] = buffer_[size_ - 1] = 0;
  }